

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

bool __thiscall
GdlExpression::TypeCheck
          (GdlExpression *this,
          vector<ExpressionType,_std::allocator<ExpressionType>_> *vexptExpected)

{
  value_type vVar1;
  ulong uVar2;
  size_type_conflict sVar3;
  reference pvVar4;
  vector<ExpressionType,_std::allocator<ExpressionType>_> *in_RSI;
  long *in_RDI;
  ExpressionType exptOkay;
  size_t i;
  ExpressionType exptFound;
  ulong local_28;
  value_type local_1c;
  vector<ExpressionType,_std::allocator<ExpressionType>_> *local_18;
  
  local_18 = in_RSI;
  uVar2 = (**(code **)(*in_RDI + 0x50))(in_RDI,&local_1c);
  if ((uVar2 & 1) != 0) {
    for (local_28 = 0;
        sVar3 = std::vector<ExpressionType,_std::allocator<ExpressionType>_>::size(local_18),
        local_28 < sVar3; local_28 = local_28 + 1) {
      pvVar4 = std::vector<ExpressionType,_std::allocator<ExpressionType>_>::operator[]
                         (local_18,local_28);
      vVar1 = *pvVar4;
      if (vVar1 == local_1c) {
        return true;
      }
      if (vVar1 == kexptUnknown) {
        return true;
      }
      if (((local_1c == kexptZero) || (local_1c == kexptOne)) &&
         (((vVar1 == kexptMeas ||
           (((vVar1 == kexptNumber || (vVar1 == kexptBoolean)) || (vVar1 == kexptZero)))) ||
          (vVar1 == kexptOne)))) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GdlExpression::TypeCheck(std::vector<ExpressionType>& vexptExpected)
{
	ExpressionType exptFound;
	if (!CheckTypeAndUnits(&exptFound))
		return false;

	for (size_t i = 0; i < vexptExpected.size(); ++i)
	{
		ExpressionType exptOkay = vexptExpected[i];
		if (exptOkay == exptFound)
			return true;
		if (exptOkay == kexptUnknown)
			return true;
		if ((exptFound == kexptZero || exptFound == kexptOne) &&
			(exptOkay == kexptMeas || exptOkay == kexptNumber || exptOkay == kexptBoolean ||
				exptOkay == kexptZero || exptOkay == kexptOne))
		{
			return true;
		}
	}
	
	return false;
}